

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O2

void __thiscall
QStandardItemModelPrivate::_q_emitItemChanged
          (QStandardItemModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QStandardItemModel *this_00;
  QStandardItem *_t1;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStandardItemModel **)&this->field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_58,topLeft);
  for (iVar1 = topLeft->r; iVar1 <= bottomRight->r; iVar1 = iVar1 + 1) {
    for (iVar2 = topLeft->c; iVar2 <= bottomRight->c; iVar2 = iVar2 + 1) {
      local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.r = -0x55555556;
      local_78.c = -0x55555556;
      local_78.i._0_4_ = 0xaaaaaaaa;
      local_78.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)this_00 + 0x60))(&local_78,this_00,iVar1,iVar2,&local_58);
      _t1 = itemFromIndex(this,&local_78);
      if (_t1 != (QStandardItem *)0x0) {
        QStandardItemModel::itemChanged(this_00,_t1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemModelPrivate::_q_emitItemChanged(const QModelIndex &topLeft,
                                                   const QModelIndex &bottomRight)
{
    Q_Q(QStandardItemModel);
    QModelIndex parent = topLeft.parent();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        for (int column = topLeft.column(); column <= bottomRight.column(); ++column) {
            QModelIndex index = q->index(row, column, parent);
            if (QStandardItem *item = itemFromIndex(index))
                emit q->itemChanged(item);
        }
    }
}